

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

void bmcg_sat_solver_var_set_frozen(bmcg_sat_solver *s,int v,int freeze)

{
  int freeze_local;
  int v_local;
  bmcg_sat_solver *s_local;
  
  Gluco::SimpSolver::setFrozen((SimpSolver *)s,v,freeze != 0);
  return;
}

Assistant:

void bmcg_sat_solver_var_set_frozen( bmcg_sat_solver* s, int v, int freeze )
{
    ((Gluco::SimpSolver*)s)->setFrozen(v, freeze != 0);
}